

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void luaG_errormsg(lua_State *L)

{
  long lVar1;
  StkId pTVar2;
  StkId pTVar3;
  int errcode;
  
  lVar1 = L->errfunc;
  if (lVar1 != 0) {
    pTVar2 = L->stack;
    if ((*(uint *)((long)&pTVar2->tt_ + lVar1) & 0xf) != 6) {
      errcode = 6;
      goto LAB_00107c53;
    }
    pTVar3 = L->top;
    pTVar3->value_ = pTVar3[-1].value_;
    pTVar3->tt_ = pTVar3[-1].tt_;
    pTVar3 = L->top;
    pTVar3[-1].value_ = *(Value *)((long)&pTVar2->value_ + lVar1);
    pTVar3[-1].tt_ = *(int *)((long)&pTVar2->tt_ + lVar1);
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    luaD_call(L,pTVar2 + -1,1,0);
  }
  errcode = 2;
LAB_00107c53:
  luaD_throw(L,errcode);
}

Assistant:

l_noret luaG_errormsg (lua_State *L) {
  if (L->errfunc != 0) {  /* is there an error handling function? */
    StkId errfunc = restorestack(L, L->errfunc);
    if (!ttisfunction(errfunc)) luaD_throw(L, LUA_ERRERR);
    setobjs2s(L, L->top, L->top - 1);  /* move argument */
    setobjs2s(L, L->top - 1, errfunc);  /* push function */
    L->top++;
    luaD_call(L, L->top - 2, 1, 0);  /* call it */
  }
  luaD_throw(L, LUA_ERRRUN);
}